

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O0

int testIsChild(void)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  int loopctr;
  int out;
  allocator<char> *in_stack_fffffffffffffba0;
  allocator<char> *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [39];
  undefined1 local_1c9 [40];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [32];
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 1; local_8 = local_8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    local_4 = (local_4 + 1) - (uint)(iVar1 == 0);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
    poVar2 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = std::operator<<(poVar2,"/Norman/Bird/Sanctuary");
    poVar2 = std::operator<<(poVar2," result=");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    local_4 = local_4 + (uint)(iVar1 != 1);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    poVar2 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = std::operator<<(poVar2,"/Norman/Bird/Sanctuary/Egret");
    poVar2 = std::operator<<(poVar2," result=");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    in_stack_fffffffffffffc2c =
         MinVR::VRDataIndex::isChild
                   ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                    in_stack_fffffffffffffc20);
    local_4 = local_4 + (uint)(in_stack_fffffffffffffc2c != 2);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    poVar2 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = std::operator<<(poVar2,"/Norman/Bird/Sanctuary/Egret/Baby");
    poVar2 = std::operator<<(poVar2," result=");
    in_stack_fffffffffffffc20 = (string *)local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)(local_1c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    local_4 = local_4 + (uint)(iVar1 != -1);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator(&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator(&local_219);
    poVar2 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = std::operator<<(poVar2,"/Norman/Bird/Egret");
    poVar2 = std::operator<<(poVar2," result=");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    in_stack_fffffffffffffbb0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(in_stack_fffffffffffffbb0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator(&local_269);
    in_stack_fffffffffffffba8 = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    in_stack_fffffffffffffba0 = &local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    local_4 = local_4 + (uint)(iVar1 != -1);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    poVar2 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar2 = std::operator<<(poVar2," to ");
    poVar2 = std::operator<<(poVar2,"hello darling");
    poVar2 = std::operator<<(poVar2," result=");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0
              );
    iVar1 = MinVR::VRDataIndex::isChild
                      ((string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator(&local_331);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator(&local_309);
  }
  return local_4;
}

Assistant:

int testIsChild() {

  int out = 0;

  LOOP {
    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                        "/Norman/Bird/Sanctuary") == 0) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                             "/Norman/Bird/Sanctuary")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                        "/Norman/Bird/Sanctuary/Egret") == 1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary/Egret"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                             "/Norman/Bird/Sanctuary/Egret")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "/Norman/Bird/Sanctuary/Egret/Baby") == 2) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary/Egret/Baby"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "/Norman/Bird/Sanctuary/Egret/Baby")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "/Norman/Bird/Egret") == -1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Egret"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "/Norman/Bird/Egret")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "hello darling") == -1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "hello darling"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "hello darling")
              << std::endl;
  }